

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O1

bool Disassembler::labelExists(int line)

{
  ulong uVar1;
  pointer ppVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0;
  if (bVar5) {
    uVar3 = ((long)labels_abi_cxx11_.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)labels_abi_cxx11_.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if ((labels_abi_cxx11_.
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first != line + 2) {
      uVar1 = 1;
      ppVar2 = labels_abi_cxx11_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        uVar4 = uVar1;
        ppVar2 = ppVar2 + 1;
        if (uVar3 + (uVar3 == 0) == uVar4) break;
        uVar1 = uVar4 + 1;
      } while (ppVar2->first != line + 2);
      bVar5 = uVar4 <= uVar3 && uVar3 - uVar4 != 0;
    }
  }
  return bVar5;
}

Assistant:

bool Disassembler::labelExists(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2)// .globl e .text
      return true;
  return false;
}